

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O0

void Hacl_GenericField32_field_free(Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k)

{
  uint32_t *__ptr;
  uint32_t *r2;
  uint32_t *n;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k_local;
  
  __ptr = k->r2;
  free(k->n);
  free(__ptr);
  free(k);
  return;
}

Assistant:

void Hacl_GenericField32_field_free(Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  uint32_t *n = k1.n;
  uint32_t *r2 = k1.r2;
  KRML_HOST_FREE(n);
  KRML_HOST_FREE(r2);
  KRML_HOST_FREE(k);
}